

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O1

_Bool mfb_wait_sync(mfb_window *window)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  double dVar6;
  XEvent event;
  XEvent local_f0;
  
  if (window != (mfb_window *)0x0) {
    if (window[0x2aa] != (mfb_window)0x1) {
      if (g_use_hardware_sync) {
        return true;
      }
      lVar1 = *(long *)window;
      XFlush(*(undefined8 *)(lVar1 + 8));
      dVar6 = mfb_timer_now(*(mfb_timer **)(lVar1 + 0x30));
      bVar4 = g_time_for_frame * 0.96 <= dVar6;
      if (!bVar4) {
        iVar5 = 1;
        do {
          if (g_time_for_frame * 0.8 <= dVar6) {
            iVar5 = 0;
          }
          usleep(iVar5 * 1000);
          if ((iVar5 == 1) && (iVar3 = XEventsQueued(*(undefined8 *)(lVar1 + 8),0), 0 < iVar3)) {
            XNextEvent(*(undefined8 *)(lVar1 + 8),&local_f0);
            processEvent((SWindowData *)window,&local_f0);
            if (window[0x2aa] == (mfb_window)0x1) {
              destroy_window_data((SWindowData *)window);
              return bVar4;
            }
          }
          dVar6 = mfb_timer_now(*(mfb_timer **)(lVar1 + 0x30));
          bVar2 = dVar6 < g_time_for_frame * 0.96;
          bVar4 = !bVar2;
        } while (bVar2);
      }
      mfb_timer_reset(*(mfb_timer **)(lVar1 + 0x30));
      return bVar4;
    }
    destroy_window_data((SWindowData *)window);
  }
  return false;
}

Assistant:

bool
mfb_wait_sync(struct mfb_window *window) {
    if (window == 0x0) {
        return false;
    }

    SWindowData *window_data = (SWindowData *) window;
    if (window_data->close) {
        destroy_window_data(window_data);
        return false;
    }

    if(g_use_hardware_sync) {
        return true;
    }

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
    XFlush(window_data_x11->display);
    XEvent      event;
    double      current;
    uint32_t    millis = 1;
    while(1) {
        current = mfb_timer_now(window_data_x11->timer);
        if (current >= g_time_for_frame * 0.96) {
            mfb_timer_reset(window_data_x11->timer);
            return true;
        }
        else if(current >= g_time_for_frame * 0.8) {
            millis = 0;
        }

        usleep(millis * 1000);
        //sched_yield();

        if(millis == 1 && XEventsQueued(window_data_x11->display, QueuedAlready) > 0) {
            XNextEvent(window_data_x11->display, &event);
            processEvent(window_data, &event);

            if(window_data->close) {
                destroy_window_data(window_data);
                return false;
            }
        }
    }

    return true;
}